

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O1

FunctionPtrList * __thiscall
Jinx::Impl::Library::Functions(FunctionPtrList *__return_storage_ptr__,Library *this)

{
  pointer pFVar1;
  int iVar2;
  FunctionSignature *fn;
  pointer pFVar3;
  pointer local_30;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_functionMutex);
  if (iVar2 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    ::reserve(__return_storage_ptr__,
              ((long)(this->m_functionList).
                     super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_functionList).
                     super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5075075075075075);
    pFVar3 = (this->m_functionList).
             super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar1 = (this->m_functionList).
             super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar3 != pFVar1) {
      do {
        local_30 = pFVar3;
        std::
        vector<Jinx::Impl::FunctionSignature_const*,Jinx::Allocator<Jinx::Impl::FunctionSignature_const*>>
        ::emplace_back<Jinx::Impl::FunctionSignature_const*>
                  ((vector<Jinx::Impl::FunctionSignature_const*,Jinx::Allocator<Jinx::Impl::FunctionSignature_const*>>
                    *)__return_storage_ptr__,&local_30);
        pFVar3 = pFVar3 + 1;
      } while (pFVar3 != pFVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_functionMutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

inline_t const FunctionPtrList Library::Functions() const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		FunctionPtrList fnList;
		fnList.reserve(m_functionList.size());
		for (const auto & fn : m_functionList)
			fnList.push_back(&fn);
		return fnList;
	}